

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::scan
               (CallIndirector *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *pPVar5;
  _func_void_CallIndirector_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_00aab999:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00aabd16;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                     ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                     super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00aab8de;
  case LoopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab540;
  case BreakId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00aabd16;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                     ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                     super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00aab155;
  case SwitchId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x00aaaee3;
  case CallId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCallIndirect,
               currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00aabd16;
    }
    break;
  case LocalSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case GlobalGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitGlobalGet,currp)
    ;
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00aabd16;
    }
    break;
  case GlobalSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitGlobalSet,currp)
    ;
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab540;
  case LoadId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_00aab8de;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_00aabd16;
  case StoreId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab607;
  case ConstId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00aabd16;
    }
    break;
  case UnaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case BinaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab8be;
  case SelectId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab234;
  case DropId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case ReturnId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00aabd16;
    }
    goto LAB_00aaaeda;
  case MemorySizeId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemorySize,currp
              );
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00aabd16;
    }
    break;
  case MemoryGrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryGrow,currp
              );
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case NopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00aabd16;
    }
    break;
  case UnreachableId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitUnreachable,
               currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00aabd16;
    }
    break;
  case AtomicRMWId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicRMW,currp)
    ;
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab6ed;
  case AtomicCmpxchgId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicCmpxchg,
               currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab6d3;
  case AtomicWaitId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicWait,currp
              );
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00aabd16;
    }
    goto LAB_00aaad61;
  case AtomicNotifyId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicNotify,
               currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab8be;
  case AtomicFenceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicFence,
               currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00aabd16;
    }
    break;
  case SIMDExtractId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDExtract,
               currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case SIMDReplaceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDReplace,
               currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00aabd16;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00aab8c9;
  case SIMDShuffleId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDShuffle,
               currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab830;
  case SIMDTernaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDTernary,
               currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00aabd16;
    }
    goto LAB_00aaad61;
  case SIMDShiftId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDShift,currp)
    ;
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab8be;
  case SIMDLoadId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab469;
  case SIMDLoadStoreLaneId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00aabd16;
    }
LAB_00aab607:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00aab8de;
  case MemoryInitId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryInit,currp
              );
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00aabd16;
    }
LAB_00aab6d3:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00aab6ed;
  case DataDropId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00aabd16;
    }
    break;
  case MemoryCopyId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryCopy,currp
              );
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab234;
  case MemoryFillId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryFill,currp
              );
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab234;
  case PopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00aabd16;
    }
    break;
  case RefNullId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00aabd16;
    }
    break;
  case RefIsNullId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefIsNull,currp)
    ;
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case RefFuncId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00aabd16;
    }
    break;
  case RefEqId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab830;
  case TableGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab540;
  case TableSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab6ed;
  case TableSizeId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableSize,currp)
    ;
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00aabd16;
    }
    break;
  case TableGrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableGrow,currp)
    ;
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00aabd16;
    }
LAB_00aab6ed:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00aab8de;
  case TryId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00aabd16;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00aab540:
    pEVar1 = pEVar1 + 2;
    goto LAB_00aab8de;
  case ThrowId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00aabd16;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTupleMake,currp)
    ;
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTupleExtract,
               currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case I31NewId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case I31GetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case CallRefId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case RefCastId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case BrOnId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00aabd16;
    }
LAB_00aab469:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00aab8de;
  case StructNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructNew,currp)
    ;
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructGet,currp)
    ;
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case StructSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructSet,currp)
    ;
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab8be;
  case ArrayNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_00aaaeda:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x00aaaee3:
    if (lVar4 != 0) {
LAB_00aab155:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                     ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                     super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNewSeg,
               currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_00aabd16;
    }
    goto LAB_00aaaf8a;
  case ArrayNewFixedId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNewFixed,
               currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00aabd16;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00aab999;
        Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                  (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab830;
  case ArraySetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab234;
  case ArrayLenId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab892;
  case ArrayCopyId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayCopy,currp)
    ;
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00aaacfb;
  case ArrayFillId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayFill,currp)
    ;
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00aabd16;
    }
LAB_00aaacfb:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00aab234;
  case ArrayInitId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayInit,currp)
    ;
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_00aabd16;
    }
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_00aaaf8a:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00aab8de;
  case RefAsId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case StringNewId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringNew,currp)
    ;
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                       ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                       super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                       ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                       super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                       ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                       super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00aab8de;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_00aabd16;
  case StringConstId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringConst,
               currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00aabd16;
    }
    break;
  case StringMeasureId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringMeasure,
               currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab642;
  case StringEncodeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringEncode,
               currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,wasm::Visitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::indirectCallsToSecondaryFunctions()::CallIndirector,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                       ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                       super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar5->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00aab8de;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_00aabd16:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringConcat,
               currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab830;
  case StringEqId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab8be;
  case StringAsId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_00aabd16;
    }
LAB_00aab642:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00aab8de;
  case StringWTF8AdvanceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_00aabd16;
    }
LAB_00aab234:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_00aab830;
  case StringWTF16GetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringWTF16Get,
               currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00aabd16;
    }
    goto LAB_00aab830;
  case StringIterNextId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringIterNext,
               currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_00aabd16;
    }
LAB_00aab892:
    pEVar1 = pEVar1 + 1;
LAB_00aab8de:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringIterMove,
               currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_00aabd16;
    }
LAB_00aab8be:
    currp_00 = pEVar1 + 2;
LAB_00aab8c9:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00aab8de;
  case StringSliceWTFId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringSliceWTF,
               currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00aabd16;
    }
LAB_00aaad61:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00aab8c9;
  case StringSliceIterId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringSliceIter,
               currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_00aabd16;
    }
LAB_00aab830:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00aab8de;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }